

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O0

void reorder_and_predict(void *scratch,void *packed,uint64_t packedbytes)

{
  char cVar1;
  char cVar2;
  int8_t *piVar3;
  int8_t *piVar4;
  int d;
  int p;
  int8_t *stop;
  int8_t *in;
  int8_t *t2;
  int8_t *t1;
  uint64_t packedbytes_local;
  void *packed_local;
  void *scratch_local;
  
  piVar3 = (int8_t *)packed;
  t2 = (int8_t *)((long)scratch + (packedbytes + 1 >> 1));
  t1 = (int8_t *)scratch;
  while (in = piVar3, in < (int8_t *)((long)packed + packedbytes)) {
    piVar3 = in + 1;
    piVar4 = t1 + 1;
    *t1 = *in;
    t1 = piVar4;
    if (piVar3 < (int8_t *)((long)packed + packedbytes)) {
      *t2 = *piVar3;
      piVar3 = in + 2;
      t2 = t2 + 1;
    }
  }
  cVar1 = *scratch;
  t1 = (int8_t *)((long)scratch + 1);
  while (t1 < (int8_t *)((long)scratch + packedbytes)) {
    cVar2 = *t1 - cVar1;
    cVar1 = *t1;
    *t1 = cVar2 + -0x80;
    t1 = t1 + 1;
  }
  return;
}

Assistant:

static void
reorder_and_predict (void* scratch, const void* packed, uint64_t packedbytes)
{
    int8_t*       t1   = (int8_t*) scratch;
    int8_t*       t2   = t1 + (packedbytes + 1) / 2;
    const int8_t* in   = (const int8_t*) packed;
    const int8_t* stop = in + packedbytes;
    while (in < stop)
    {
        *(t1++) = *(in++);
        if (in < stop) *(t2++) = *(in++);
    }

    t1    = (int8_t*) scratch;
    stop  = t1 + packedbytes;
    int p = *(t1++);
    while (t1 < stop)
    {
        int d = (int) (*t1) - p + (128 + 256);
        p     = *t1;
        *t1++ = (int8_t) (d);
    }
}